

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::GaussianPlumeRecord
          (GaussianPlumeRecord *this,KUINT8 Index,WorldCoordinates *Location,
          EulerAngles *Orientation,Vector *LWH,Vector *DDT,KFLOAT32 LECH,Vector *LEV)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GaussianPlumeRecord_00223fb8;
  (this->m_SrcLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223b28;
  KVar1 = Location->m_f64Y;
  (this->m_SrcLocation).m_f64X = Location->m_f64X;
  (this->m_SrcLocation).m_f64Y = KVar1;
  (this->m_SrcLocation).m_f64Z = Location->m_f64Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_002235b0;
  KVar2 = Orientation->m_f32Theta;
  (this->m_Ori).m_f32Psi = Orientation->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar2;
  (this->m_Ori).m_f32Phi = Orientation->m_f32Phi;
  (this->m_PlumeLWH).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223ad0;
  KVar2 = LWH->m_f32Y;
  (this->m_PlumeLWH).m_f32X = LWH->m_f32X;
  (this->m_PlumeLWH).m_f32Y = KVar2;
  (this->m_PlumeLWH).m_f32Z = LWH->m_f32Z;
  (this->m_DDTLEH).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00223ad0
  ;
  KVar2 = DDT->m_f32Y;
  (this->m_DDTLEH).m_f32X = DDT->m_f32X;
  (this->m_DDTLEH).m_f32Y = KVar2;
  (this->m_DDTLEH).m_f32Z = DDT->m_f32Z;
  this->m_f32LdEdgeCenHght = LECH;
  (this->m_LdEdgeVel).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223ad0;
  KVar2 = LEV->m_f32Y;
  (this->m_LdEdgeVel).m_f32X = LEV->m_f32X;
  (this->m_LdEdgeVel).m_f32Y = KVar2;
  (this->m_LdEdgeVel).m_f32Z = LEV->m_f32Z;
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x60000000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x280;
  return;
}

Assistant:

GaussianPlumeRecord::GaussianPlumeRecord( KUINT8 Index, const WorldCoordinates & Location, const EulerAngles & Orientation,
        const Vector & LWH, const Vector & DDT, KFLOAT32 LECH, const Vector & LEV ) :
    m_SrcLocation( Location ),
    m_Ori( Orientation ),
    m_PlumeLWH( LWH ),
    m_DDTLEH( DDT ),
    m_f32LdEdgeCenHght( LECH ),
    m_LdEdgeVel( LEV ),
    m_ui32Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = GaussianPlumeRecordType;
    m_ui16Length = ( GAUSSIAN_PLUME_RECORD_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}